

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77_test.cpp
# Opt level: O2

void __thiscall DecryptLz77::test_method(DecryptLz77 *this)

{
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  undefined1 local_f8 [8];
  string out_msg;
  string in_msg;
  undefined **local_b0;
  undefined1 local_a8;
  undefined8 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_msg,"-d",&local_f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out_msg,"Lz77",&local_fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB",&local_fb);
  Cryptor::cryptor_factory((string *)local_f8,&in_msg,&out_msg);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&out_msg);
  std::__cxx11::string::~string((string *)&in_msg);
  std::__cxx11::string::string((string *)&in_msg,(string *)((long)local_f8 + 8));
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x23);
  out_msg._M_string_length._0_1_ = 0;
  out_msg._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0010e998;
  out_msg.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  out_msg.field_2._8_8_ = (long)"Not possible mode: " + 0x13;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[46]>
            (&out_msg,&local_60,0x23,1,2,&in_msg,"in_msg",
             "AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB",
             "\"AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB\"");
  (**(code **)(*(long *)local_f8 + 0x10))();
  std::__cxx11::string::string((string *)&out_msg,(string *)((long)local_f8 + 0x28));
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x29);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_0010e998;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[44]>
            (&local_b0,&local_90,0x29,1,2,&out_msg,"out_msg",
             "AAAAABBAAACCCCAAAAAAACCCCBBBBBBBDDAAAABBBBB",
             "\"AAAAABBAAACCCCAAAAAAACCCCBBBBBBBDDAAAABBBBB\"");
  std::__cxx11::string::~string((string *)&out_msg);
  std::__cxx11::string::~string((string *)&in_msg);
  if (local_f8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_f8 + 8))();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(DecryptLz77) {

  auto cryptor = Cryptor::cryptor_factory(
    "-d",
    "Lz77",
    "AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB"
  );

  const auto in_msg = cryptor->get_in_message();

  BOOST_CHECK_EQUAL(in_msg, "AAAAABBAAACCCC[13,4]A[11,6]BBBBBBBDD[33,6]BBB");

  cryptor->run();

  const auto out_msg = cryptor->get_out_message();

  BOOST_CHECK_EQUAL(out_msg, "AAAAABBAAACCCCAAAAAAACCCCBBBBBBBDDAAAABBBBB");
}